

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

char * testing::internal::ParseFlagValue(char *str,char *flag,bool def_optional)

{
  int iVar1;
  char *pcVar2;
  string flag_str;
  allocator local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (flag == (char *)0x0 || str == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    std::__cxx11::string::string((string *)&local_40,"--",&local_81);
    std::operator+(&local_80,&local_40,"gtest_");
    std::operator+(&local_60,&local_80,flag);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_40);
    iVar1 = strncmp(str,local_60._M_dataplus._M_p,local_60._M_string_length);
    if (iVar1 == 0) {
      pcVar2 = str + local_60._M_string_length;
      if (((!def_optional) || (str[local_60._M_string_length] != '\0')) &&
         (pcVar2 = pcVar2 + 1, str[local_60._M_string_length] != '=')) {
        pcVar2 = (char *)0x0;
      }
    }
    else {
      pcVar2 = (char *)0x0;
    }
    std::__cxx11::string::~string((string *)&local_60);
  }
  return pcVar2;
}

Assistant:

const char* ParseFlagValue(const char* str,
                           const char* flag,
                           bool def_optional) {
  // str and flag must not be NULL.
  if (str == NULL || flag == NULL) return NULL;

  // The flag must start with "--" followed by GTEST_FLAG_PREFIX_.
  const std::string flag_str = std::string("--") + GTEST_FLAG_PREFIX_ + flag;
  const size_t flag_len = flag_str.length();
  if (strncmp(str, flag_str.c_str(), flag_len) != 0) return NULL;

  // Skips the flag name.
  const char* flag_end = str + flag_len;

  // When def_optional is true, it's OK to not have a "=value" part.
  if (def_optional && (flag_end[0] == '\0')) {
    return flag_end;
  }

  // If def_optional is true and there are more characters after the
  // flag name, or if def_optional is false, there must be a '=' after
  // the flag name.
  if (flag_end[0] != '=') return NULL;

  // Returns the string after "=".
  return flag_end + 1;
}